

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O3

void Abc_NtkCovCovers_rec(Cov_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vBoundary)

{
  int iVar1;
  int *piVar2;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  long *plVar3;
  long *plVar4;
  Min_Man_t *pMVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  Vec_Int_t **ppVVar10;
  Vec_Int_t **ppVVar11;
  Vec_Int_t *__ptr;
  Min_Man_t **ppMVar12;
  Min_Cube_t *pMVar13;
  Min_Cube_t *pMVar14;
  Min_Cube_t *pCube;
  Min_Cube_t *pMVar15;
  void **ppvVar16;
  long lVar17;
  Min_Cube_t *pMVar18;
  Min_Cube_t **ppMVar19;
  Min_Cube_t **ppMVar20;
  ulong uVar21;
  uint uVar22;
  Vec_Int_t *pVVar23;
  uint uVar24;
  uint uVar25;
  
  if ((*(uint *)&pObj->field_0x14 & 0x30) != 0) {
    return;
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x20;
  piVar2 = (pObj->vFanins).pArray;
  ppvVar16 = pObj->pNtk->vObjs->pArray;
  pObj_00 = (Abc_Obj_t *)ppvVar16[*piVar2];
  pObj_01 = (Abc_Obj_t *)ppvVar16[piVar2[1]];
  Abc_NtkCovCovers_rec(p,pObj_00,vBoundary);
  Abc_NtkCovCovers_rec(p,pObj_01,vBoundary);
  if ((pObj_00->field_0x14 & 0x10) == 0) {
    iVar9 = pObj_00->Id;
    if (((long)iVar9 < 0) ||
       (lVar17 = *(long *)((long)pObj_00->pNtk->pManCut + 0x18), *(int *)(lVar17 + 4) <= iVar9))
    goto LAB_0044b1b5;
    if (*(long *)(*(long *)(*(long *)(lVar17 + 8) + (long)iVar9 * 8) + 0x18) != 0)
    goto LAB_0044a824;
  }
  else {
LAB_0044a824:
    if ((pObj_01->field_0x14 & 0x10) == 0) {
      iVar9 = pObj_01->Id;
      if (((long)iVar9 < 0) ||
         (lVar17 = *(long *)((long)pObj_01->pNtk->pManCut + 0x18), *(int *)(lVar17 + 4) <= iVar9))
      goto LAB_0044b1b5;
      if (*(long *)(*(long *)(*(long *)(lVar17 + 8) + (long)iVar9 * 8) + 0x18) == 0)
      goto LAB_0044af79;
    }
    piVar2 = (pObj->vFanins).pArray;
    ppvVar16 = pObj->pNtk->vObjs->pArray;
    plVar3 = (long *)ppvVar16[*piVar2];
    plVar4 = (long *)ppvVar16[piVar2[1]];
    if ((*(byte *)((long)plVar3 + 0x14) & 0x10) != 0) {
      if (p->vTriv0->nSize < 1) goto LAB_0044b1d4;
      *p->vTriv0->pArray = (int)plVar3[2];
    }
    if ((*(byte *)((long)plVar4 + 0x14) & 0x10) != 0) {
      if (p->vTriv1->nSize < 1) {
LAB_0044b1d4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *p->vTriv1->pArray = (int)plVar4[2];
    }
    if ((*(byte *)((long)plVar3 + 0x14) & 0x10) == 0) {
      iVar9 = (int)plVar3[2];
      if (((long)iVar9 < 0) ||
         (lVar17 = *(long *)(*(long *)(*plVar3 + 0x110) + 0x18), *(int *)(lVar17 + 4) <= iVar9))
      goto LAB_0044b1b5;
      ppVVar10 = (Vec_Int_t **)(*(long *)(*(long *)(lVar17 + 8) + (long)iVar9 * 8) + 0x18);
    }
    else {
      ppVVar10 = &p->vTriv0;
    }
    if ((*(byte *)((long)plVar4 + 0x14) & 0x10) == 0) {
      iVar9 = (int)plVar4[2];
      if (((long)iVar9 < 0) ||
         (lVar17 = *(long *)(*(long *)(*plVar4 + 0x110) + 0x18), *(int *)(lVar17 + 4) <= iVar9))
      goto LAB_0044b1b5;
      ppVVar11 = (Vec_Int_t **)(*(long *)(*(long *)(lVar17 + 8) + (long)iVar9 * 8) + 0x18);
    }
    else {
      ppVVar11 = &p->vTriv1;
    }
    __ptr = Abc_NodeCovSupport(p,*ppVVar10,*ppVVar11);
    iVar9 = __ptr->nSize;
    if (iVar9 <= p->nFaninMax) {
      uVar25 = *(uint *)&pObj->field_0x14 >> 10 & 1;
      uVar22 = *(uint *)&pObj->field_0x14 >> 0xb & 1;
      if (p->fUseEsop == 0) {
        pMVar13 = (Min_Cube_t *)0x0;
      }
      else {
        if ((*(byte *)((long)plVar3 + 0x14) & 0x10) == 0) {
          iVar1 = (int)plVar3[2];
          if (((long)iVar1 < 0) ||
             (lVar17 = *(long *)(*(long *)(*plVar3 + 0x110) + 0x18), *(int *)(lVar17 + 4) <= iVar1))
          goto LAB_0044b1b5;
          ppMVar12 = (Min_Man_t **)((long)iVar1 * 8 + *(long *)(lVar17 + 8));
          lVar17 = 0x10;
        }
        else {
          ppMVar12 = &p->pManMin;
          lVar17 = 0x20;
        }
        pMVar14 = *(Min_Cube_t **)((long)(*ppMVar12)->pTriv0 + lVar17 + -0x20);
        if ((*(byte *)((long)plVar4 + 0x14) & 0x10) == 0) {
          iVar1 = (int)plVar4[2];
          if (((long)iVar1 < 0) ||
             (lVar17 = *(long *)(*(long *)(*plVar4 + 0x110) + 0x18), *(int *)(lVar17 + 4) <= iVar1))
          goto LAB_0044b1b5;
          ppMVar12 = (Min_Man_t **)((long)iVar1 * 8 + *(long *)(lVar17 + 8));
          lVar17 = 0x10;
        }
        else {
          ppMVar12 = &p->pManMin;
          lVar17 = 0x30;
        }
        pMVar13 = (Min_Cube_t *)0x0;
        if ((pMVar14 != (Min_Cube_t *)0x0) &&
           (pMVar15 = *(Min_Cube_t **)((long)(*ppMVar12)->pTriv0 + lVar17 + -0x20),
           pMVar15 != (Min_Cube_t *)0x0)) {
          pMVar13 = pMVar14;
          if (uVar25 != 0) {
            if (*(uint *)&pMVar14->field_0x8 < 0x400000) {
              pMVar13 = pMVar14->pNext;
            }
            else {
              pMVar13 = p->pManMin->pOne0;
              pMVar13->pNext = pMVar14;
            }
          }
          if (uVar22 != 0) {
            if (*(uint *)&pMVar15->field_0x8 < 0x400000) {
              pMVar15 = pMVar15->pNext;
            }
            else {
              pMVar14 = p->pManMin->pOne1;
              pMVar14->pNext = pMVar15;
              pMVar15 = pMVar14;
            }
          }
          pMVar13 = Abc_NodeCovProduct(p,pMVar13,pMVar15,1,iVar9);
        }
      }
      if (p->fUseSop == 0) {
        pMVar14 = (Min_Cube_t *)0x0;
LAB_0044aea8:
        pMVar15 = (Min_Cube_t *)0x0;
      }
      else {
        uVar24 = *(uint *)((long)plVar3 + 0x14);
        if ((uVar24 & 0x10) == 0) {
          iVar1 = (int)plVar3[2];
          if (((long)iVar1 < 0) ||
             (lVar17 = *(long *)(*(long *)(*plVar3 + 0x110) + 0x18), *(int *)(lVar17 + 4) <= iVar1))
          goto LAB_0044b1b5;
          ppMVar19 = (Min_Cube_t **)
                     ((ulong)(uVar25 * 8) + *(long *)(*(long *)(lVar17 + 8) + (long)iVar1 * 8));
        }
        else {
          ppMVar19 = p->pManMin->pTriv0 + uVar25;
        }
        if ((*(byte *)((long)plVar4 + 0x14) & 0x10) == 0) {
          iVar1 = (int)plVar4[2];
          if (((long)iVar1 < 0) ||
             (lVar17 = *(long *)(*(long *)(*plVar4 + 0x110) + 0x18), *(int *)(lVar17 + 4) <= iVar1))
          goto LAB_0044b1b5;
          ppMVar20 = (Min_Cube_t **)
                     ((ulong)(uVar22 * 8) + *(long *)(*(long *)(lVar17 + 8) + (long)iVar1 * 8));
        }
        else {
          ppMVar20 = p->pManMin->pTriv1 + uVar22;
        }
        pMVar14 = (Min_Cube_t *)0x0;
        if ((*ppMVar19 != (Min_Cube_t *)0x0) && (*ppMVar20 != (Min_Cube_t *)0x0)) {
          pMVar14 = Abc_NodeCovProduct(p,*ppMVar19,*ppMVar20,0,iVar9);
          uVar24 = *(uint *)((long)plVar3 + 0x14);
        }
        if ((uVar24 & 0x10) == 0) {
          iVar1 = (int)plVar3[2];
          if (((long)iVar1 < 0) ||
             (lVar17 = *(long *)(*(long *)(*plVar3 + 0x110) + 0x18), *(int *)(lVar17 + 4) <= iVar1))
          goto LAB_0044b1b5;
          ppMVar19 = (Min_Cube_t **)
                     ((ulong)((uVar25 ^ 1) << 3) +
                     *(long *)(*(long *)(lVar17 + 8) + (long)iVar1 * 8));
        }
        else {
          ppMVar19 = p->pManMin->pTriv0 + (uVar25 ^ 1);
        }
        pMVar15 = *ppMVar19;
        if ((*(byte *)((long)plVar4 + 0x14) & 0x10) == 0) {
          iVar1 = (int)plVar4[2];
          if (((long)iVar1 < 0) ||
             (lVar17 = *(long *)(*(long *)(*plVar4 + 0x110) + 0x18), *(int *)(lVar17 + 4) <= iVar1))
          goto LAB_0044b1b5;
          ppMVar19 = (Min_Cube_t **)
                     ((ulong)((uVar22 ^ 1) << 3) +
                     *(long *)(*(long *)(lVar17 + 8) + (long)iVar1 * 8));
        }
        else {
          ppMVar19 = p->pManMin->pTriv1 + (uVar22 ^ 1);
        }
        if ((pMVar15 == (Min_Cube_t *)0x0) || (pMVar18 = *ppMVar19, pMVar18 == (Min_Cube_t *)0x0))
        goto LAB_0044aea8;
        Min_ManClean(p->pManMin,iVar9);
        do {
          pMVar5 = p->pManMin;
          pCube = (Min_Cube_t *)Extra_MmFixedEntryFetch(pMVar5->pMemMan);
          pCube->pNext = (Min_Cube_t *)0x0;
          uVar22 = pMVar5->nVars & 0x3ff;
          *(uint *)&pCube->field_0x8 = *(uint *)&pCube->field_0x8 & 0xfffffc00 | uVar22;
          uVar22 = (pMVar5->nWords & 0xfffU) << 10 | uVar22;
          *(uint *)&pCube->field_0x8 = uVar22;
          memset(pCube->uData,0xff,(long)pMVar5->nWords << 2);
          *(uint *)&pCube->field_0x8 = uVar22;
          pVVar23 = p->vComTo0;
          if (0 < pVVar23->nSize) {
            bVar8 = 0;
            uVar21 = 0;
            do {
              iVar1 = pVVar23->pArray[uVar21];
              if ((iVar1 != -1) &&
                 (uVar25 = pMVar15->uData[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU) & 3,
                 uVar25 != 3)) {
                pCube->uData[uVar21 >> 4 & 0xfffffff] =
                     pCube->uData[uVar21 >> 4 & 0xfffffff] ^ (uVar25 ^ 3) << (bVar8 & 0x1e);
                uVar22 = uVar22 + 0x400000;
                *(uint *)&pCube->field_0x8 = uVar22;
                pVVar23 = p->vComTo0;
              }
              uVar21 = uVar21 + 1;
              bVar8 = bVar8 + 2;
            } while ((long)uVar21 < (long)pVVar23->nSize);
          }
          pMVar5 = p->pManMin;
          if (p->nCubesMax < pMVar5->nCubes) {
            pMVar15 = Min_CoverCollect(pMVar5,iVar9);
            if (pMVar15 != (Min_Cube_t *)0x0) {
              pMVar5 = p->pManMin;
              do {
                pMVar18 = pMVar15->pNext;
                Extra_MmFixedEntryRecycle(pMVar5->pMemMan,(char *)pMVar15);
                pMVar15 = pMVar18;
              } while (pMVar18 != (Min_Cube_t *)0x0);
            }
            goto LAB_0044af24;
          }
          Min_SopAddCube(pMVar5,pCube);
          pMVar15 = pMVar15->pNext;
        } while (pMVar15 != (Min_Cube_t *)0x0);
        do {
          pMVar5 = p->pManMin;
          pMVar15 = (Min_Cube_t *)Extra_MmFixedEntryFetch(pMVar5->pMemMan);
          pMVar15->pNext = (Min_Cube_t *)0x0;
          uVar22 = pMVar5->nVars & 0x3ff;
          *(uint *)&pMVar15->field_0x8 = *(uint *)&pMVar15->field_0x8 & 0xfffffc00 | uVar22;
          uVar22 = (pMVar5->nWords & 0xfffU) << 10 | uVar22;
          *(uint *)&pMVar15->field_0x8 = uVar22;
          memset(pMVar15->uData,0xff,(long)pMVar5->nWords << 2);
          *(uint *)&pMVar15->field_0x8 = uVar22;
          pVVar23 = p->vComTo1;
          if (0 < pVVar23->nSize) {
            bVar8 = 0;
            uVar21 = 0;
            do {
              iVar1 = pVVar23->pArray[uVar21];
              if ((iVar1 != -1) &&
                 (uVar25 = pMVar18->uData[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU) & 3,
                 uVar25 != 3)) {
                pMVar15->uData[uVar21 >> 4 & 0xfffffff] =
                     pMVar15->uData[uVar21 >> 4 & 0xfffffff] ^ (uVar25 ^ 3) << (bVar8 & 0x1e);
                uVar22 = uVar22 + 0x400000;
                *(uint *)&pMVar15->field_0x8 = uVar22;
                pVVar23 = p->vComTo1;
              }
              uVar21 = uVar21 + 1;
              bVar8 = bVar8 + 2;
            } while ((long)uVar21 < (long)pVVar23->nSize);
          }
          pMVar5 = p->pManMin;
          if (p->nCubesMax < pMVar5->nCubes) {
            pMVar15 = Min_CoverCollect(pMVar5,iVar9);
            if (pMVar15 != (Min_Cube_t *)0x0) {
              pMVar5 = p->pManMin;
              do {
                pMVar18 = pMVar15->pNext;
                Extra_MmFixedEntryRecycle(pMVar5->pMemMan,(char *)pMVar15);
                pMVar15 = pMVar18;
              } while (pMVar18 != (Min_Cube_t *)0x0);
            }
            goto LAB_0044af24;
          }
          Min_SopAddCube(pMVar5,pMVar15);
          pMVar18 = pMVar18->pNext;
        } while (pMVar18 != (Min_Cube_t *)0x0);
        Min_SopMinimize(p->pManMin);
        pMVar15 = Min_CoverCollect(p->pManMin,iVar9);
        if (pMVar15 == (Min_Cube_t *)0x0) {
LAB_0044af24:
          pMVar15 = (Min_Cube_t *)0x0;
        }
        else {
          iVar9 = -1;
          pMVar18 = pMVar15;
          do {
            pMVar18 = pMVar18->pNext;
            iVar9 = iVar9 + 1;
          } while (pMVar18 != (Min_Cube_t *)0x0);
          if (p->nFaninMax <= iVar9) {
            pMVar5 = p->pManMin;
            do {
              pMVar18 = pMVar15->pNext;
              Extra_MmFixedEntryRecycle(pMVar5->pMemMan,(char *)pMVar15);
              pMVar15 = pMVar18;
            } while (pMVar18 != (Min_Cube_t *)0x0);
            goto LAB_0044af24;
          }
        }
      }
      if (((pMVar15 != (Min_Cube_t *)0x0) || (pMVar13 != (Min_Cube_t *)0x0)) ||
         (pMVar14 != (Min_Cube_t *)0x0)) {
        iVar9 = pObj->Id;
        lVar17 = (long)iVar9;
        if ((-1 < lVar17) &&
           (lVar6 = *(long *)((long)pObj->pNtk->pManCut + 0x18), iVar9 < *(int *)(lVar6 + 4))) {
          lVar6 = *(long *)(lVar6 + 8);
          lVar7 = *(long *)(lVar6 + lVar17 * 8);
          if (*(long *)(lVar7 + 0x18) != 0) {
            __assert_fail("Abc_ObjGetSupp(pObj) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                          ,0x1bb,"int Abc_NodeCovPropagate(Cov_Man_t *, Abc_Obj_t *)");
          }
          *(Vec_Int_t **)(lVar7 + 0x18) = __ptr;
          **(undefined8 **)(lVar6 + lVar17 * 8) = pMVar14;
          lVar6 = *(long *)((long)pObj->pNtk->pManCut + 0x18);
          if (iVar9 < *(int *)(lVar6 + 4)) {
            *(Min_Cube_t **)(*(long *)(*(long *)(lVar6 + 8) + lVar17 * 8) + 8) = pMVar15;
            lVar6 = *(long *)((long)pObj->pNtk->pManCut + 0x18);
            if (iVar9 < *(int *)(lVar6 + 4)) {
              *(Min_Cube_t **)(*(long *)(*(long *)(lVar6 + 8) + lVar17 * 8) + 0x10) = pMVar13;
              iVar9 = p->nSupps + 1;
              p->nSupps = iVar9;
              if (iVar9 < p->nSuppsMax) {
                iVar9 = p->nSuppsMax;
              }
              p->nSuppsMax = iVar9;
              return;
            }
          }
        }
        goto LAB_0044b1b5;
      }
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
LAB_0044af79:
  if ((pObj_00->field_0x14 & 0x10) == 0) {
    iVar9 = pObj_00->Id;
    if (((long)iVar9 < 0) ||
       (lVar17 = *(long *)((long)pObj_00->pNtk->pManCut + 0x18), *(int *)(lVar17 + 4) <= iVar9))
    goto LAB_0044b1b5;
    if (*(long *)(*(long *)(*(long *)(lVar17 + 8) + (long)iVar9 * 8) + 0x18) != 0) {
      uVar22 = vBoundary->nSize;
      if (uVar22 == vBoundary->nCap) {
        if ((int)uVar22 < 0x10) {
          if (vBoundary->pArray == (void **)0x0) {
            ppvVar16 = (void **)malloc(0x80);
          }
          else {
            ppvVar16 = (void **)realloc(vBoundary->pArray,0x80);
          }
          vBoundary->pArray = ppvVar16;
          vBoundary->nCap = 0x10;
        }
        else {
          if (vBoundary->pArray == (void **)0x0) {
            ppvVar16 = (void **)malloc((ulong)uVar22 << 4);
          }
          else {
            ppvVar16 = (void **)realloc(vBoundary->pArray,(ulong)uVar22 << 4);
          }
          vBoundary->pArray = ppvVar16;
          vBoundary->nCap = uVar22 * 2;
        }
      }
      else {
        ppvVar16 = vBoundary->pArray;
      }
      iVar9 = vBoundary->nSize;
      vBoundary->nSize = iVar9 + 1;
      ppvVar16[iVar9] = pObj_00;
    }
  }
  if ((pObj_01->field_0x14 & 0x10) == 0) {
    iVar9 = pObj_01->Id;
    if (((long)iVar9 < 0) ||
       (lVar17 = *(long *)((long)pObj_01->pNtk->pManCut + 0x18), *(int *)(lVar17 + 4) <= iVar9)) {
LAB_0044b1b5:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (*(long *)(*(long *)(*(long *)(lVar17 + 8) + (long)iVar9 * 8) + 0x18) != 0) {
      uVar22 = vBoundary->nSize;
      if (uVar22 == vBoundary->nCap) {
        if ((int)uVar22 < 0x10) {
          if (vBoundary->pArray == (void **)0x0) {
            ppvVar16 = (void **)malloc(0x80);
          }
          else {
            ppvVar16 = (void **)realloc(vBoundary->pArray,0x80);
          }
          vBoundary->pArray = ppvVar16;
          vBoundary->nCap = 0x10;
        }
        else {
          if (vBoundary->pArray == (void **)0x0) {
            ppvVar16 = (void **)malloc((ulong)uVar22 << 4);
          }
          else {
            ppvVar16 = (void **)realloc(vBoundary->pArray,(ulong)uVar22 << 4);
          }
          vBoundary->pArray = ppvVar16;
          vBoundary->nCap = uVar22 * 2;
        }
      }
      else {
        ppvVar16 = vBoundary->pArray;
      }
      iVar9 = vBoundary->nSize;
      vBoundary->nSize = iVar9 + 1;
      ppvVar16[iVar9] = pObj_01;
    }
  }
  return;
}

Assistant:

void Abc_NtkCovCovers_rec( Cov_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vBoundary )
{
    Abc_Obj_t * pObj0, * pObj1;
    // return if the support is already computed
    if ( pObj->fMarkB || pObj->fMarkA )//|| Abc_ObjGetSupp(pObj) ) // why do we need Supp check here???
        return;
    // mark as visited
    pObj->fMarkB = 1;
    // get the fanins
    pObj0 = Abc_ObjFanin0(pObj);
    pObj1 = Abc_ObjFanin1(pObj);
    // solve for the fanins
    Abc_NtkCovCovers_rec( p, pObj0, vBoundary );
    Abc_NtkCovCovers_rec( p, pObj1, vBoundary );
    // skip the node that spaced out
    if ( (!pObj0->fMarkA && !Abc_ObjGetSupp(pObj0)) ||  // fanin is not ready
         (!pObj1->fMarkA && !Abc_ObjGetSupp(pObj1)) ||  // fanin is not ready
         !Abc_NodeCovPropagate( p, pObj ) )           // node's support or covers cannot be computed
    {
        // save the nodes of the future boundary
        if ( !pObj0->fMarkA && Abc_ObjGetSupp(pObj0) )
            Vec_PtrPush( vBoundary, pObj0 );
        if ( !pObj1->fMarkA && Abc_ObjGetSupp(pObj1) )
            Vec_PtrPush( vBoundary, pObj1 );
        return;
    }
    // consider dropping the fanin supports
//    Abc_NodeCovDropData( p, pObj0 );
//    Abc_NodeCovDropData( p, pObj1 );
}